

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_functional.h
# Opt level: O1

void __thiscall mp::PLPoints::AddPoint(PLPoints *this,double x,double y)

{
  double dVar1;
  double *pdVar2;
  iterator iVar3;
  pointer pdVar4;
  ulong uVar5;
  long lVar6;
  double local_18;
  double local_10;
  
  pdVar2 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3._M_current =
       (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((pdVar2 == iVar3._M_current) || (iVar3._M_current[-1] + 0.0001 < x)) {
    uVar5 = (long)iVar3._M_current - (long)pdVar2;
    if (1 < (int)(uVar5 >> 3)) {
      lVar6 = uVar5 * 0x20000000;
      pdVar4 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar4[lVar6 + -0x100000000 >> 0x20] == y) {
        dVar1 = pdVar4[lVar6 + -0x200000000 >> 0x20];
        if ((dVar1 == y) && (!NAN(dVar1) && !NAN(y))) {
          iVar3._M_current[-1] = x;
          return;
        }
      }
    }
    local_18 = y;
    local_10 = x;
    if (iVar3._M_current ==
        (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)this,iVar3,&local_10);
    }
    else {
      *iVar3._M_current = x;
      (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = iVar3._M_current + 1;
    }
    iVar3._M_current =
         (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&this->y_,iVar3,&local_18);
    }
    else {
      *iVar3._M_current = local_18;
      (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = iVar3._M_current + 1;
    }
  }
  return;
}

Assistant:

void AddPoint(double x, double y) {
    if (!empty())
      assert(x > x_.back());
    if (empty() || x>x_.back()+1e-4) {  // skip near points for Gurobi
      if (size()>=2 &&                  // simple check: 3rd equal y
         y_[size()-1]==y && y_[size()-2]==y) {
        x_.back() = x;                  // update last x
      } else {
        x_.push_back(x);
        y_.push_back(y);
      }
    }
  }